

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int lat_fwd_bwd(s3lattice_t *lat)

{
  double dVar1;
  s3arc_s *psVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  float64 fVar9;
  float64 fVar10;
  double dVar11;
  
  uVar6 = 0;
  do {
    uVar7 = (ulong)lat->n_arcs;
    if (uVar7 <= uVar6) {
      fVar9 = -10000000000.0;
      do {
        lat->prob = fVar9;
        do {
          do {
            uVar7 = uVar7 - 1;
            if ((int)(uint)uVar7 < 0) {
              uVar4 = lat->n_arcs;
              dVar11 = (double)(float)lm_scale;
              for (lVar5 = 0; (ulong)uVar4 * 0xd8 - lVar5 != 0; lVar5 = lVar5 + 0xd8) {
                psVar2 = lat->arc;
                *(undefined8 *)((long)&psVar2->gamma + lVar5) = 0xc202a05f20000000;
                if (*(int *)((long)&psVar2->good_arc + lVar5) == 1) {
                  *(double *)((long)&psVar2->gamma + lVar5) =
                       (*(double *)((long)&psVar2->alpha + lVar5) +
                       *(double *)((long)&psVar2->beta + lVar5)) -
                       (*(double *)((long)&psVar2->ac_score + lVar5) / dVar11 +
                        *(double *)((long)&psVar2->lm_score + lVar5) + (double)lat->prob);
                }
              }
              lat->postprob = 0.0;
              uVar3 = uVar4 - lat->n_true_arcs;
              lVar5 = (long)(int)uVar3 * 0xd8 + 0xb0;
              dVar11 = 0.0;
              for (; uVar3 < uVar4; uVar3 = uVar3 + 1) {
                dVar11 = dVar11 + *(double *)(lat->arc->word + lVar5);
                lat->postprob = (float64)dVar11;
                lVar5 = lVar5 + 0xd8;
              }
              return 0;
            }
            psVar2 = lat->arc;
            uVar4 = (uint)uVar7 & 0x7fffffff;
            psVar2[uVar4].beta = -10000000000.0;
          } while (psVar2[uVar4].good_arc != 1);
          dVar11 = (double)psVar2[uVar4].lm_score;
          dVar1 = (double)psVar2[uVar4].ac_score;
          dVar8 = (double)(float)lm_scale;
          uVar6 = 0;
          while( true ) {
            if (psVar2[uVar4].n_next_arcs <= uVar6) break;
            if (psVar2[uVar4].next_arcs[uVar6] == 0) {
              fVar9 = psVar2[uVar4].beta;
              fVar10 = 0.0;
            }
            else {
              fVar9 = psVar2[uVar4].beta;
              fVar10 = psVar2[psVar2[uVar4].next_arcs[uVar6] - 1].beta;
            }
            fVar9 = log_add(fVar9,fVar10);
            psVar2 = lat->arc;
            psVar2[uVar4].beta = fVar9;
            uVar6 = uVar6 + 1;
          }
          dVar11 = dVar11 + dVar1 / dVar8 + (double)psVar2[uVar4].beta;
          psVar2[uVar4].beta = (float64)dVar11;
        } while (psVar2[uVar4].sf != 1);
        fVar9 = log_add(lat->prob,(float64)dVar11);
      } while( true );
    }
    psVar2 = lat->arc;
    psVar2[uVar6].alpha = -10000000000.0;
    if (psVar2[uVar6].good_arc == 1) {
      dVar11 = (double)psVar2[uVar6].lm_score;
      dVar1 = (double)psVar2[uVar6].ac_score;
      dVar8 = (double)(float)lm_scale;
      uVar7 = 0;
      while( true ) {
        if (psVar2[uVar6].n_prev_arcs <= uVar7) break;
        if (psVar2[uVar6].prev_arcs[uVar7] == 0) {
          if (psVar2[uVar6].sf == 1) {
            fVar9 = psVar2[uVar6].alpha;
            fVar10 = 0.0;
            goto LAB_00109019;
          }
        }
        else {
          uVar4 = psVar2[uVar6].prev_arcs[uVar7] - 1;
          if (psVar2[uVar4].good_arc == 1) {
            fVar9 = psVar2[uVar6].alpha;
            fVar10 = psVar2[uVar4].alpha;
LAB_00109019:
            fVar9 = log_add(fVar9,fVar10);
            psVar2 = lat->arc;
            psVar2[uVar6].alpha = fVar9;
          }
        }
        uVar7 = uVar7 + 1;
      }
      psVar2[uVar6].alpha = (float64)(dVar11 + dVar1 / dVar8 + (double)psVar2[uVar6].alpha);
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

int
lat_fwd_bwd(s3lattice_t *lat)
{
  int i, j;
  uint32 id;
  float64 ac_score, lm_score;

  /* step forward */
  for (i=0; i<lat->n_arcs; i++) {
    /* initialise alpha */
    lat->arc[i].alpha = LOG_ZERO;
    if (lat->arc[i].good_arc == 1) {
      /* get the acoustic and lm socre for a word hypothesis */
      ac_score = lat->arc[i].ac_score / lm_scale;
      lm_score = lat->arc[i].lm_score;

      /* compute alpha */
      for (j=0; j<lat->arc[i].n_prev_arcs; j++) {
	id = lat->arc[i].prev_arcs[j];
	if (id == 0) {
	  if (lat->arc[i].sf == 1) {
	    lat->arc[i].alpha = log_add(lat->arc[i].alpha, 0);
	  }
	}
	else {
	  if (lat->arc[id-1].good_arc == 1)
	    lat->arc[i].alpha = log_add(lat->arc[i].alpha, lat->arc[id-1].alpha);
	}
      }
      lat->arc[i].alpha += ac_score + lm_score;
    }
  }

  /* initialise overall log-likelihood */
  lat->prob = LOG_ZERO;

  /* step backward */
  for (i=lat->n_arcs-1; i>=0 ;i--) {
    /* initialise beta */
    lat->arc[i].beta = LOG_ZERO;

    if (lat->arc[i].good_arc == 1) {
      /* get the acoustic and lm socre for a word hypothesis */
      ac_score = lat->arc[i].ac_score / lm_scale;
      lm_score = lat->arc[i].lm_score;

      /* compute beta */
      for (j=0; j<lat->arc[i].n_next_arcs; j++) {
	id = lat->arc[i].next_arcs[j];
	if (id == 0) {
	  lat->arc[i].beta = log_add(lat->arc[i].beta, 0);
	}
	else {
	  if (lat->arc[id-1].good_arc == 1)
        ;
	  lat->arc[i].beta = log_add(lat->arc[i].beta, lat->arc[id-1].beta);
	}
      }
      lat->arc[i].beta += ac_score + lm_score;

      /* compute overall log-likelihood loglid=beta(1)=alpha(Q) */
      if (lat->arc[i].sf == 1)
	lat->prob = log_add(lat->prob, lat->arc[i].beta);
    }
  }

  /* compute gamma */
  for (i=0; i<lat->n_arcs; i++)
    {
      /* initialise gamma */
      lat->arc[i].gamma = LOG_ZERO;
      if (lat->arc[i].good_arc == 1)
	{
	  ac_score = lat->arc[i].ac_score / lm_scale;
	  lm_score = lat->arc[i].lm_score;
	  lat->arc[i].gamma = lat->arc[i].alpha + lat->arc[i].beta - (ac_score + lm_score + lat->prob);
	}
    }

  /* compute the posterior probability of the true path */
  lat->postprob = 0;
  for (i=lat->n_arcs-lat->n_true_arcs; i<lat->n_arcs; i++)
    lat->postprob += lat->arc[i].gamma;
  
  return S3_SUCCESS;
}